

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void av1_init_plane_quantizers(AV1_COMP *cpi,MACROBLOCK *x,int segment_id,int do_update)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  CommonQuantParams *quant_params_00;
  int in_ECX;
  int in_EDX;
  MACROBLOCK *in_RSI;
  AV1_COMP *in_RDI;
  MACROBLOCKD *xd;
  int qindex_change;
  int rdmult;
  int qindex_rdmult;
  int current_rd_qindex;
  int qindex;
  int current_qindex;
  int qindex_rd;
  FRAME_TYPE frame_type;
  int layer_depth;
  int boost_index;
  GF_GROUP *gf_group;
  CommonQuantParams *quant_params;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  FRAME_TYPE in_stack_ffffffffffffff43;
  aom_bit_depth_t layer_depth_00;
  FRAME_UPDATE_TYPE update_type;
  int segment_id_00;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  aom_tune_metric in_stack_ffffffffffffff70;
  aom_tune_metric local_8c;
  int local_88;
  aom_bit_depth_t local_68;
  int local_64;
  int local_40;
  
  quant_params_00 = &(in_RDI->common).quant_params;
  if ((in_RDI->ppi->p_rc).gfu_boost / 100 < 0x10) {
    local_64 = (in_RDI->ppi->p_rc).gfu_boost / 100;
  }
  else {
    local_64 = 0xf;
  }
  if ((in_RDI->ppi->gf_group).layer_depth[in_RDI->gf_frame_index] < 6) {
    local_68 = (in_RDI->ppi->gf_group).layer_depth[in_RDI->gf_frame_index];
  }
  else {
    local_68 = 6;
  }
  iVar2 = av1_get_qindex((segmentation *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
  local_40 = iVar2;
  if ((in_RDI->oxcf).sb_qp_sweep != 0) {
    if ((in_RDI->common).delta_q_info.delta_q_present_flag == 0) {
      local_88 = quant_params_00->base_qindex;
    }
    else {
      local_88 = quant_params_00->base_qindex + in_RSI->rdmult_delta_qindex;
    }
    if (local_88 < 0x100) {
      if ((in_RDI->common).delta_q_info.delta_q_present_flag == 0) {
        in_stack_ffffffffffffff70 = quant_params_00->base_qindex;
        local_8c = in_stack_ffffffffffffff70;
      }
      else {
        in_stack_ffffffffffffff70 = quant_params_00->base_qindex + in_RSI->rdmult_delta_qindex;
        local_8c = in_stack_ffffffffffffff70;
      }
    }
    else {
      local_8c = 0xff;
    }
    if (-1 < (int)local_8c) {
      if ((in_RDI->common).delta_q_info.delta_q_present_flag == 0) {
        in_stack_ffffffffffffff68 = quant_params_00->base_qindex;
      }
      else {
        in_stack_ffffffffffffff68 = quant_params_00->base_qindex + in_RSI->rdmult_delta_qindex;
      }
      if (in_stack_ffffffffffffff68 < 0x100) {
        if ((in_RDI->common).delta_q_info.delta_q_present_flag == 0) {
          in_stack_ffffffffffffff60 = quant_params_00->base_qindex;
          in_stack_ffffffffffffff64 = in_stack_ffffffffffffff60;
        }
        else {
          in_stack_ffffffffffffff60 = quant_params_00->base_qindex + in_RSI->rdmult_delta_qindex;
          in_stack_ffffffffffffff64 = in_stack_ffffffffffffff60;
        }
      }
      else {
        in_stack_ffffffffffffff64 = 0xff;
      }
    }
    local_40 = av1_get_qindex((segmentation *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                              in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
  }
  iVar3 = local_40 + (in_RDI->common).quant_params.y_dc_delta_q;
  layer_depth_00 = ((in_RDI->common).seq_params)->bit_depth;
  update_type = (in_RDI->ppi->gf_group).update_type[in_RDI->gf_frame_index];
  segment_id_00 = (in_RDI->oxcf).q_cfg.use_fixed_qp_offsets;
  is_stat_consumption_stage
            ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  iVar3 = av1_compute_rd_mult(local_64,local_68,update_type,layer_depth_00,iVar3,
                              in_stack_ffffffffffffff43,in_stack_ffffffffffffff60,
                              in_stack_ffffffffffffff68,in_stack_ffffffffffffff70);
  if ((in_RSI->qindex != iVar2) || (in_ECX != 0)) {
    set_q_index(&in_RDI->enc_quant_dequant_params,iVar2,in_RSI);
  }
  if ((in_EDX != in_RSI->prev_segment_id) ||
     (_Var1 = av1_use_qmatrix(quant_params_00,&in_RSI->e_mbd,in_EDX), _Var1)) {
    set_qmatrix((CommonQuantParams *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                segment_id_00,(MACROBLOCKD *)CONCAT44(local_64,local_68));
  }
  iVar2 = segfeature_active(&(in_RDI->common).seg,(uint8_t)in_EDX,'\x06');
  in_RSI->seg_skip_block = iVar2;
  av1_set_error_per_bit(&in_RSI->errorperbit,iVar3);
  av1_set_sad_per_bit(in_RDI,&in_RSI->sadperbit,local_40);
  in_RSI->prev_segment_id = in_EDX;
  return;
}

Assistant:

void av1_init_plane_quantizers(const AV1_COMP *cpi, MACROBLOCK *x,
                               int segment_id, const int do_update) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonQuantParams *const quant_params = &cm->quant_params;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;
  int qindex_rd;

  const int current_qindex = AOMMAX(
      0,
      AOMMIN(QINDEX_RANGE - 1, cm->delta_q_info.delta_q_present_flag
                                   ? quant_params->base_qindex + x->delta_qindex
                                   : quant_params->base_qindex));
  const int qindex = av1_get_qindex(&cm->seg, segment_id, current_qindex);

  if (cpi->oxcf.sb_qp_sweep) {
    const int current_rd_qindex =
        AOMMAX(0, AOMMIN(QINDEX_RANGE - 1, cm->delta_q_info.delta_q_present_flag
                                               ? quant_params->base_qindex +
                                                     x->rdmult_delta_qindex
                                               : quant_params->base_qindex));
    qindex_rd = av1_get_qindex(&cm->seg, segment_id, current_rd_qindex);
  } else {
    qindex_rd = qindex;
  }

  const int qindex_rdmult = qindex_rd + quant_params->y_dc_delta_q;
  const int rdmult = av1_compute_rd_mult(
      qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

  const int qindex_change = x->qindex != qindex;
  if (qindex_change || do_update) {
    set_q_index(&cpi->enc_quant_dequant_params, qindex, x);
  }

  MACROBLOCKD *const xd = &x->e_mbd;
  if ((segment_id != x->prev_segment_id) ||
      av1_use_qmatrix(quant_params, xd, segment_id)) {
    set_qmatrix(quant_params, segment_id, xd);
  }

  x->seg_skip_block = segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP);

  av1_set_error_per_bit(&x->errorperbit, rdmult);
  av1_set_sad_per_bit(cpi, &x->sadperbit, qindex_rd);

  x->prev_segment_id = segment_id;
}